

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerMessageDeflate.h
# Opt level: O2

void __thiscall uWS::ZlibContext::ZlibContext(ZlibContext *this)

{
  char *pcVar1;
  
  (this->dynamicDeflationBuffer)._M_dataplus._M_p = (pointer)&(this->dynamicDeflationBuffer).field_2
  ;
  (this->dynamicDeflationBuffer)._M_string_length = 0;
  (this->dynamicDeflationBuffer).field_2._M_local_buf[0] = '\0';
  (this->dynamicInflationBuffer)._M_dataplus._M_p = (pointer)&(this->dynamicInflationBuffer).field_2
  ;
  (this->dynamicInflationBuffer)._M_string_length = 0;
  (this->dynamicInflationBuffer).field_2._M_local_buf[0] = '\0';
  pcVar1 = (char *)malloc(0x4000);
  this->deflationBuffer = pcVar1;
  pcVar1 = (char *)malloc(0x4000);
  this->inflationBuffer = pcVar1;
  return;
}

Assistant:

ZlibContext() {
        deflationBuffer = (char *) malloc(LARGE_BUFFER_SIZE);
        inflationBuffer = (char *) malloc(LARGE_BUFFER_SIZE);
    }